

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O1

void __thiscall absl::lts_20250127::cord_internal::CordzHandle::~CordzHandle(CordzHandle *this)

{
  iterator iVar1;
  CordzHandle *pCVar2;
  CordzHandle **ppCVar3;
  CordzHandle *next;
  vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
  to_delete;
  CordzHandle *local_40;
  CordzHandle **local_38;
  iterator iStack_30;
  CordzHandle **local_28;
  
  this->_vptr_CordzHandle = (_func_int **)&PTR__CordzHandle_00463f10;
  anon_unknown_0::GlobalQueue();
  if (this->is_snapshot_ == true) {
    local_38 = (CordzHandle **)0x0;
    iStack_30._M_current = (CordzHandle **)0x0;
    local_28 = (CordzHandle **)0x0;
    Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
    local_40 = this->dq_next_;
    if (this->dq_prev_ == (CordzHandle *)0x0) {
      if (local_40 != (CordzHandle *)0x0) {
        do {
          if (local_40->is_snapshot_ != false) break;
          if (iStack_30._M_current == local_28) {
            std::
            vector<absl::lts_20250127::cord_internal::CordzHandle*,std::allocator<absl::lts_20250127::cord_internal::CordzHandle*>>
            ::_M_realloc_insert<absl::lts_20250127::cord_internal::CordzHandle*const&>
                      ((vector<absl::lts_20250127::cord_internal::CordzHandle*,std::allocator<absl::lts_20250127::cord_internal::CordzHandle*>>
                        *)&local_38,iStack_30,&local_40);
          }
          else {
            *iStack_30._M_current = local_40;
            iStack_30._M_current = iStack_30._M_current + 1;
          }
          local_40 = local_40->dq_next_;
        } while (local_40 != (CordzHandle *)0x0);
      }
    }
    else {
      this->dq_prev_->dq_next_ = local_40;
    }
    pCVar2 = this->dq_prev_;
    if (local_40 != (CordzHandle *)0x0) {
      local_40->dq_prev_ = this->dq_prev_;
      pCVar2 = (CordzHandle *)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
    }
    anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ = pCVar2;
    Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
    iVar1._M_current = iStack_30._M_current;
    for (ppCVar3 = local_38; ppCVar3 != iVar1._M_current; ppCVar3 = ppCVar3 + 1) {
      if (*ppCVar3 != (CordzHandle *)0x0) {
        (*(*ppCVar3)->_vptr_CordzHandle[1])();
      }
    }
    if (local_38 != (CordzHandle **)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  return;
}

Assistant:

CordzHandle::~CordzHandle() {
  Queue& global_queue = GlobalQueue();
  if (is_snapshot_) {
    std::vector<CordzHandle*> to_delete;
    {
      MutexLock lock(&global_queue.mutex);
      CordzHandle* next = dq_next_;
      if (dq_prev_ == nullptr) {
        // We were head of the queue, delete every CordzHandle until we reach
        // either the end of the list, or a snapshot handle.
        while (next && !next->is_snapshot_) {
          to_delete.push_back(next);
          next = next->dq_next_;
        }
      } else {
        // Another CordzHandle existed before this one, don't delete anything.
        dq_prev_->dq_next_ = next;
      }
      if (next) {
        next->dq_prev_ = dq_prev_;
      } else {
        global_queue.dq_tail.store(dq_prev_, std::memory_order_release);
      }
    }
    for (CordzHandle* handle : to_delete) {
      delete handle;
    }
  }
}